

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::ImageTest::getGlslSampler_abi_cxx11_
          (string *__return_storage_ptr__,ImageTest *this,TextureFormat *format,VkImageViewType type
          ,VkDescriptorType samplingType,int imageCount)

{
  char *pcVar1;
  VkImageViewType type_00;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string texImage;
  allocator<char> local_49;
  string local_48 [8];
  string texSampler;
  int imageCount_local;
  VkDescriptorType samplingType_local;
  VkImageViewType type_local;
  TextureFormat *format_local;
  
  pcVar1 = "texSampler";
  if (1 < (int)samplingType) {
    pcVar1 = "texSamplers[i]";
  }
  texSampler.field_2._12_4_ = samplingType;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar1,&local_49);
  std::allocator<char>::~allocator(&local_49);
  type_00 = 0x12d678a;
  pcVar1 = "texImage";
  if (1 < (int)texSampler.field_2._12_4_) {
    pcVar1 = "texImages[i]";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,pcVar1,&local_81);
  std::allocator<char>::~allocator(&local_81);
  if ((type == VK_IMAGE_VIEW_TYPE_2D) || (type != VK_IMAGE_VIEW_TYPE_3D)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_48);
  }
  else {
    getGlslSamplerType_abi_cxx11_
              (&local_e8,this,(TextureFormat *)((ulong)format & 0xffffffff),type_00);
    std::operator+(&local_c8,&local_e8,"(");
    std::operator+(&local_a8,&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::operator+(__return_storage_ptr__,&local_a8,", texSampler)");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageTest::getGlslSampler (const tcu::TextureFormat& format, VkImageViewType type, VkDescriptorType samplingType, int imageCount)
{
	std::string texSampler	= imageCount > 1 ? "texSamplers[i]" : "texSampler";
	std::string texImage	= imageCount > 1 ? "texImages[i]" : "texImage";

	switch (samplingType)
	{
		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
			return getGlslSamplerType(format, type) + "(" + texImage + ", texSampler)";
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
		default:
			return texSampler;
	}
}